

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QDockWidgetGroupWindow * __thiscall
QMainWindowLayout::createTabbedDockWindow(QMainWindowLayout *this)

{
  QDockWidgetGroupWindow *parent;
  QWidget *parent_00;
  QDockWidgetGroupLayout *this_00;
  
  parent = (QDockWidgetGroupWindow *)operator_new(0x58);
  parent_00 = QLayout::parentWidget((QLayout *)this);
  QDockWidgetGroupWindow::QDockWidgetGroupWindow
            ((QDockWidgetGroupWindow *)parent,parent_00,(WindowFlags)0xb);
  this_00 = (QDockWidgetGroupLayout *)operator_new(0x170);
  QDockWidgetGroupLayout::QDockWidgetGroupLayout(this_00,parent);
  return parent;
}

Assistant:

QDockWidgetGroupWindow *QMainWindowLayout::createTabbedDockWindow()
{
    QDockWidgetGroupWindow* f = new QDockWidgetGroupWindow(parentWidget(), Qt::Tool);
    new QDockWidgetGroupLayout(f);
    return f;
}